

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O1

glyph_t * plutovg_font_face_get_glyph(plutovg_font_face_t *face,plutovg_codepoint_t codepoint)

{
  stbtt_fontinfo *info;
  byte *pbVar1;
  uchar *puVar2;
  long lVar3;
  int iVar4;
  glyph_t **ppgVar5;
  glyph_t *pvertices;
  long lVar6;
  ushort uVar7;
  uint uVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  ushort uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  stbtt__csctx local_68;
  
  uVar12 = (ulong)codepoint;
  uVar11 = (ulong)(codepoint >> 8) & 0xff;
  if (face->glyphs[uVar11] == (glyph_t **)0x0) {
    uVar12 = 8;
    ppgVar5 = (glyph_t **)calloc(0x100,8);
    face->glyphs[uVar11] = ppgVar5;
  }
  uVar18 = (ulong)codepoint & 0xff;
  if (face->glyphs[uVar11][uVar18] != (glyph_t *)0x0) goto LAB_001255bf;
  pvertices = (glyph_t *)malloc(0x28);
  puVar2 = (face->info).data;
  uVar8 = (face->info).index_map;
  uVar9 = (ulong)uVar8;
  uVar7 = *(ushort *)(puVar2 + uVar9) << 8;
  uVar16 = *(ushort *)(puVar2 + uVar9) >> 8;
  uVar13 = uVar7 | uVar16;
  if (uVar13 < 7) {
    uVar12 = (long)&switchD_001251d5::switchdataD_001449e0 +
             (long)(int)(&switchD_001251d5::switchdataD_001449e0)[uVar13];
    switch(uVar13) {
    case 0:
      if ((int)codepoint <
          (int)((ushort)(*(ushort *)(puVar2 + uVar9 + 2) << 8 | *(ushort *)(puVar2 + uVar9 + 2) >> 8
                        ) - 6)) {
        uVar19 = (uint)puVar2[(long)(int)codepoint + uVar9 + 6];
      }
      else {
LAB_00125283:
        uVar19 = 0;
      }
      break;
    default:
      goto switchD_001251d5_caseD_1;
    case 2:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-truetype.h"
                    ,0x5ea,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
    case 4:
      if (0xffff < (int)codepoint) goto LAB_00125283;
      uVar7 = *(ushort *)(puVar2 + uVar9 + 6) << 8 | *(ushort *)(puVar2 + uVar9 + 6) >> 8;
      uVar16 = *(ushort *)(puVar2 + uVar9 + 10) << 8 | *(ushort *)(puVar2 + uVar9 + 10) >> 8;
      uVar12 = (ulong)(puVar2[uVar9 + 0xd] & 0xfffffffe) | (ulong)puVar2[uVar9 + 0xc] << 8;
      uVar19 = 0;
      if ((int)codepoint <
          (int)(uint)(ushort)(*(ushort *)(puVar2 + uVar12 + (uVar8 + 0xe)) << 8 |
                             *(ushort *)(puVar2 + uVar12 + (uVar8 + 0xe)) >> 8)) {
        uVar12 = 0;
      }
      uVar14 = uVar8 + (int)uVar12 + 0xc;
      if (uVar16 != 0) {
        uVar20 = (uint)(ushort)(*(ushort *)(puVar2 + uVar9 + 8) << 8 |
                               *(ushort *)(puVar2 + uVar9 + 8) >> 8);
        do {
          uVar20 = uVar20 >> 1;
          uVar15 = uVar20 & 0xfffffffe;
          if ((int)codepoint <=
              (int)(uint)(ushort)(*(ushort *)(puVar2 + (ulong)uVar15 + (ulong)uVar14) << 8 |
                                 *(ushort *)(puVar2 + (ulong)uVar15 + (ulong)uVar14) >> 8)) {
            uVar15 = 0;
          }
          uVar14 = uVar15 + uVar14;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      uVar12 = (ulong)((uVar14 - uVar8) + 0x1fff4 & 0x1fffe);
      uVar14 = (uint)(ushort)(*(ushort *)(puVar2 + uVar12 + (uVar7 & 0xfffffffe) + uVar9 + 0x10) <<
                              8 | *(ushort *)(puVar2 + uVar12 + (uVar7 & 0xfffffffe) + uVar9 + 0x10)
                                  >> 8);
      if (((int)uVar14 <= (int)codepoint) &&
         (uVar19 = 0,
         (int)codepoint <=
         (int)(uint)(ushort)(*(ushort *)(puVar2 + uVar12 + (uVar8 + 0xe)) << 8 |
                            *(ushort *)(puVar2 + uVar12 + (uVar8 + 0xe)) >> 8))) {
        uVar7 = uVar7 >> 1;
        lVar3 = (ulong)((uint)uVar7 + (uint)uVar7) * 3;
        uVar16 = *(ushort *)(puVar2 + uVar12 + 2 + lVar3 + uVar9 + 0xe) << 8 |
                 *(ushort *)(puVar2 + uVar12 + 2 + lVar3 + uVar9 + 0xe) >> 8;
        if (uVar16 == 0) {
          uVar19 = (ushort)(*(ushort *)(puVar2 + uVar12 + 2 + (ulong)uVar7 * 4 + uVar9 + 0xe) << 8 |
                           *(ushort *)(puVar2 + uVar12 + 2 + (ulong)uVar7 * 4 + uVar9 + 0xe) >> 8) +
                   codepoint;
        }
        else {
          uVar19 = (uint)(ushort)(*(ushort *)
                                   (puVar2 + uVar12 + 0x10 +
                                             (long)(int)((codepoint - uVar14) * 2) +
                                             lVar3 + uVar9 + uVar16) << 8 |
                                 *(ushort *)
                                  (puVar2 + uVar12 + 0x10 +
                                            (long)(int)((codepoint - uVar14) * 2) +
                                            lVar3 + uVar9 + uVar16) >> 8);
        }
      }
      uVar19 = uVar19 & 0xffff;
      break;
    case 6:
      uVar7 = *(ushort *)(puVar2 + uVar9 + 6) << 8 | *(ushort *)(puVar2 + uVar9 + 6) >> 8;
      uVar19 = 0;
      if ((uVar7 <= codepoint) &&
         (codepoint <
          (uint)(ushort)(*(ushort *)(puVar2 + uVar9 + 8) << 8 | *(ushort *)(puVar2 + uVar9 + 8) >> 8
                        ) + (uint)uVar7)) {
        uVar19 = (uint)(ushort)(*(ushort *)(puVar2 + (ulong)((codepoint - uVar7) * 2) + uVar9 + 10)
                                << 8 | *(ushort *)
                                        (puVar2 + (ulong)((codepoint - uVar7) * 2) + uVar9 + 10) >>
                                       8);
      }
    }
  }
  else {
switchD_001251d5_caseD_1:
    if ((uVar7 | uVar16 & 0xfffe) != 0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-truetype.h"
                    ,0x631,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
    }
    uVar8 = *(uint *)(puVar2 + uVar9 + 0xc);
    uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    iVar4 = 0;
    do {
      if (uVar8 - iVar4 == 0 || (int)uVar8 < iVar4) goto LAB_00125283;
      uVar14 = ((int)(uVar8 - iVar4) >> 1) + iVar4;
      lVar3 = (long)(int)uVar14 * 0xc;
      uVar19 = *(uint *)(puVar2 + lVar3 + uVar9 + 0x10);
      uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
      bVar21 = true;
      iVar17 = codepoint - uVar19;
      if (uVar19 <= codepoint) {
        uVar19 = *(uint *)(puVar2 + lVar3 + uVar9 + 0x14);
        if ((uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18) <
            codepoint) {
          iVar4 = uVar14 + 1;
          uVar14 = uVar8;
        }
        else {
          bVar21 = false;
          uVar19 = *(uint *)(puVar2 + lVar3 + uVar9 + 0x18);
          if (uVar13 != 0xc) {
            iVar17 = 0;
          }
          uVar12 = (ulong)(iVar17 + (uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 |
                                     (uVar19 & 0xff00) << 8 | uVar19 << 0x18));
          uVar14 = uVar8;
        }
      }
      uVar8 = uVar14;
      uVar19 = (uint)uVar12;
    } while (bVar21);
  }
  info = &face->info;
  pvertices->index = uVar19;
  iVar4 = stbtt_GetGlyphShape(info,uVar19,(stbtt_vertex **)pvertices);
  pvertices->nvertices = iVar4;
  iVar4 = pvertices->index;
  puVar2 = (face->info).data;
  uVar7 = *(ushort *)(puVar2 + (long)(face->info).hhea + 0x22) << 8 |
          *(ushort *)(puVar2 + (long)(face->info).hhea + 0x22) >> 8;
  iVar17 = (face->info).hmtx;
  if (iVar4 < (int)(uint)uVar7) {
    pbVar1 = puVar2 + (long)iVar4 * 4 + (long)iVar17;
    pbVar10 = pbVar1 + 2;
    pvertices->advance_width = (int)(short)((ushort)*pbVar1 << 8) | (uint)pbVar1[1];
    lVar3 = (long)iVar4 * 4 + (long)iVar17 + 3;
  }
  else {
    uVar12 = (ulong)(uint)uVar7;
    lVar3 = uVar12 * 4 + (long)iVar17;
    pvertices->advance_width =
         (int)(short)((ushort)puVar2[uVar12 * 4 + (long)iVar17 + -4] << 8) |
         (uint)puVar2[uVar12 * 4 + (long)iVar17 + -3];
    lVar6 = (long)(int)((iVar4 - (uint)uVar7) * 2);
    pbVar10 = puVar2 + lVar6 + lVar3;
    lVar3 = lVar6 + lVar3 + 1;
  }
  pvertices->left_side_bearing = (int)(short)((ushort)*pbVar10 << 8) | (uint)puVar2[lVar3];
  if ((face->info).cff.size == 0) {
    uVar8 = stbtt__GetGlyfOffset(info,pvertices->index);
    if ((int)uVar8 < 0) {
      pvertices->x1 = 0;
      pvertices->y1 = 0;
      pvertices->x2 = 0;
      pvertices->y2 = 0;
    }
    else {
      puVar2 = (face->info).data;
      pvertices->x1 =
           (int)(short)((ushort)puVar2[(ulong)uVar8 + 2] << 8) | (uint)puVar2[(ulong)uVar8 + 3];
      pvertices->y1 =
           (int)(short)((ushort)puVar2[(ulong)uVar8 + 4] << 8) | (uint)puVar2[(ulong)uVar8 + 5];
      pvertices->x2 =
           (int)(short)((ushort)puVar2[(ulong)uVar8 + 6] << 8) | (uint)puVar2[(ulong)uVar8 + 7];
      pvertices->y2 =
           (int)(short)((ushort)puVar2[(ulong)uVar8 + 8] << 8) | (uint)puVar2[(ulong)uVar8 + 9];
    }
  }
  else {
    local_68.first_x = 0.0;
    local_68.first_y = 0.0;
    local_68.min_y = 0;
    local_68.max_y = 0;
    local_68.pvertices = (stbtt_vertex *)0x0;
    local_68.x = 0.0;
    local_68.y = 0.0;
    local_68.min_x = 0;
    local_68.max_x = 0;
    local_68.num_vertices = 0;
    local_68._52_4_ = 0;
    local_68.bounds = 1;
    local_68.started = 0;
    iVar4 = stbtt__run_charstring(info,pvertices->index,&local_68);
    bVar21 = iVar4 == 0;
    iVar17 = local_68.min_x;
    if (bVar21) {
      iVar17 = 0;
    }
    pvertices->x1 = iVar17;
    iVar17 = local_68.min_y;
    if (bVar21) {
      iVar17 = 0;
    }
    pvertices->y1 = iVar17;
    if (bVar21) {
      local_68.max_x = 0;
    }
    pvertices->x2 = local_68.max_x;
    if (!bVar21) {
      iVar4 = local_68.max_y;
    }
    pvertices->y2 = iVar4;
  }
  face->glyphs[uVar11][uVar18] = pvertices;
LAB_001255bf:
  return face->glyphs[uVar11][uVar18];
}

Assistant:

static glyph_t* plutovg_font_face_get_glyph(plutovg_font_face_t* face, plutovg_codepoint_t codepoint)
{
    unsigned int msb = (codepoint >> 8) & 0xFF;
    if(face->glyphs[msb] == NULL) {
        face->glyphs[msb] = calloc(GLYPH_CACHE_SIZE, sizeof(glyph_t*));
    }

    unsigned int lsb = codepoint & 0xFF;
    if(face->glyphs[msb][lsb] == NULL) {
        glyph_t* glyph = malloc(sizeof(glyph_t));
        glyph->index = stbtt_FindGlyphIndex(&face->info, codepoint);
        glyph->nvertices = stbtt_GetGlyphShape(&face->info, glyph->index, &glyph->vertices);
        stbtt_GetGlyphHMetrics(&face->info, glyph->index, &glyph->advance_width, &glyph->left_side_bearing);
        if(!stbtt_GetGlyphBox(&face->info, glyph->index, &glyph->x1, &glyph->y1, &glyph->x2, &glyph->y2))
            glyph->x1 = glyph->y1 = glyph->x2 = glyph->y2 = 0;
        face->glyphs[msb][lsb] = glyph;
    }

    return face->glyphs[msb][lsb];
}